

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.cpp
# Opt level: O0

void macro_AppendArg(MacroArgs **argPtr,char *s)

{
  uint uVar1;
  MacroArgs *pMVar2;
  int *piVar3;
  char *pcVar4;
  char *s_local;
  MacroArgs **argPtr_local;
  
  if (*s == '\0') {
    warning(WARNING_EMPTY_MACRO_ARG,"Empty macro argument\n");
  }
  if ((*argPtr)->nbArgs == 99999) {
    error("A maximum of 99999 arguments is allowed\n");
  }
  if ((*argPtr)->capacity <= (*argPtr)->nbArgs) {
    (*argPtr)->capacity = (*argPtr)->capacity << 1;
    if ((*argPtr)->capacity <= (*argPtr)->nbArgs) {
      fatalerror("Failed to add new macro argument: capacity overflow\n");
    }
    pMVar2 = (MacroArgs *)realloc(*argPtr,(ulong)(*argPtr)->capacity * 8 + 0x10);
    *argPtr = pMVar2;
    if (*argPtr == (MacroArgs *)0x0) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      fatalerror("Error adding new macro argument: %s\n",pcVar4);
    }
  }
  pMVar2 = *argPtr;
  uVar1 = (*argPtr)->nbArgs;
  (*argPtr)->nbArgs = uVar1 + 1;
  *(char **)(&pMVar2[1].nbArgs + (ulong)uVar1 * 2) = s;
  return;
}

Assistant:

void macro_AppendArg(struct MacroArgs **argPtr, char *s)
{
#define macArgs (*argPtr)
	if (s[0] == '\0')
		warning(WARNING_EMPTY_MACRO_ARG, "Empty macro argument\n");
	if (macArgs->nbArgs == MAXMACROARGS)
		error("A maximum of " EXPAND_AND_STR(MAXMACROARGS) " arguments is allowed\n");
	if (macArgs->nbArgs >= macArgs->capacity) {
		macArgs->capacity *= 2;
		// Check that overflow didn't roll us back
		if (macArgs->capacity <= macArgs->nbArgs)
			fatalerror("Failed to add new macro argument: capacity overflow\n");
		macArgs = (struct MacroArgs *)realloc(macArgs, SIZEOF_ARGS(macArgs->capacity));
		if (!macArgs)
			fatalerror("Error adding new macro argument: %s\n", strerror(errno));
	}
	macArgs->args[macArgs->nbArgs++] = s;
#undef macArgs
}